

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stacktrace_unittest.cc
# Opt level: O2

void CheckStackTraceLeaf(int i)

{
  uint uVar1;
  uint uVar2;
  void *__ptr;
  undefined8 uVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  void *unaff_retaddr;
  char *pcVar11;
  undefined1 local_50 [8];
  vector<void_*,_std::allocator<void_*>_> stack;
  
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_50,(long)leaf_capture_len + 1,
             (allocator_type *)
             ((long)&stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar5 = leaf_capture_len;
  *(void **)((long)local_50 + (long)leaf_capture_len * 8) = (void *)0x42;
  if (expected_range[1].start < unaff_retaddr) {
    if (expected_range[1].end < unaff_retaddr) {
      printf("Adjusting range from %p..%p to %p..%p\n",expected_range[1].start,expected_range[1].end
             ,expected_range[1].start,unaff_retaddr);
      expected_range[1].end = unaff_retaddr;
      iVar5 = leaf_capture_len;
    }
    uVar2 = (*leaf_capture_fn)((void **)local_50,iVar5);
    if (*(void **)((long)local_50 + (long)leaf_capture_len * 8) == (void *)0x42) {
      __ptr = (void *)backtrace_symbols(local_50,uVar2);
      uVar8 = 0;
      if (0 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        printf("%s %p\n",*(undefined8 *)((long)__ptr + uVar9 * 8),
               *(void **)((long)local_50 + uVar9 * 8));
      }
      printf("CheckStackTrace() addr: %p\n",CheckStackTrace);
      free(__ptr);
      uVar10 = 0;
      for (lVar4 = 0; ((int)uVar10 < 6 && (lVar4 < (int)uVar2)); lVar4 = lVar4 + 1) {
        uVar1 = 1;
        if (uVar10 != 1 || lVar4 != 1) {
          printf("Backtrace %d: expected: %p..%p  actual: %p ... ",(ulong)uVar10,
                 expected_range[(int)uVar10].start,expected_range[(int)uVar10].end,
                 *(void **)((long)local_50 + lVar4 * 8));
          fflush(_stdout);
          CheckRetAddrIsInFunction
                    (*(void **)((long)local_50 + lVar4 * 8),expected_range + (int)uVar10);
          puts("OK");
          uVar1 = uVar10 + 1;
        }
        uVar10 = uVar1;
      }
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                ((_Vector_base<void_*,_std::allocator<void_*>_> *)local_50);
      return;
    }
    pcVar11 = "(void*)0x42";
    pcVar6 = "stack[leaf_capture_len]";
    pcVar7 = "==";
    uVar3 = 0x11d;
  }
  else {
    pcVar11 = "ra";
    pcVar6 = "(&expected_range[1])->start";
    pcVar7 = "<";
    uVar3 = 0x11a;
  }
  fprintf(_stderr,"%s:%d Check failed: %s %s %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/stacktrace_unittest.cc"
          ,uVar3,pcVar6,pcVar7,pcVar11);
  abort();
}

Assistant:

void ATTRIBUTE_NOINLINE CheckStackTraceLeaf(int i) {
  std::vector<void*> stack(leaf_capture_len + 1);
  stack[leaf_capture_len] = (void*)0x42;  // we will check that this value is not overwritten
  int size = 0;

  ADJUST_ADDRESS_RANGE_FROM_RA(&expected_range[1]);

  size = leaf_capture_fn(stack.data(), leaf_capture_len);
  CHECK_EQ(stack[leaf_capture_len], (void*)0x42);

#ifdef HAVE_EXECINFO_H
  {
    char **strings = backtrace_symbols(stack.data(), size);
    for (int i = 0; i < size; i++)
      printf("%s %p\n", strings[i], stack[i]);
    printf("CheckStackTrace() addr: %p\n", &CheckStackTrace);
    free(strings);
  }
#endif

  for (int i = 0, j = 0; i < BACKTRACE_STEPS && j < size; i++, j++) {
    if (i == 1 && j == 1) {
      // this is expected to be our function for which we don't
      // establish bounds. So skip.
      i--;
      continue;
    }
    printf("Backtrace %d: expected: %p..%p  actual: %p ... ",
           i, expected_range[i].start, expected_range[i].end, stack[j]);
    fflush(stdout);
    CheckRetAddrIsInFunction(stack[j], expected_range[i]);
    printf("OK\n");
  }
}